

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::MultipoleAtypeParameters> *this,string *id,
          MultipoleAtypeParameters *data)

{
  string *in_RDX;
  GenericData *in_RSI;
  MultipoleAtypeParameters *in_RDI;
  MultipoleAtypeParameters *in_stack_ffffffffffffffc8;
  
  GenericData::GenericData(in_RSI,in_RDX);
  *(undefined ***)in_RDI = &PTR__SimpleTypeData_004ff4b0;
  MultipoleAtypeParameters::MultipoleAtypeParameters(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}